

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::SegmentBTree::InsertNonFullNode
               (Recycler *recycler,SegmentBTree *node,SparseArraySegmentBase *newSeg)

{
  Type *addr;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ulong uVar6;
  Recycler *pRVar7;
  uint *puVar8;
  SparseArraySegmentBase **ppSVar9;
  SegmentBTree *pSVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    uVar3 = node->segmentCount;
    if (uVar3 == 0x27) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x135,"(!node->IsFullNode())","!node->IsFullNode()");
      if (!bVar2) goto LAB_00b69aec;
      *puVar5 = 0;
      uVar3 = node->segmentCount;
    }
    if (0x26 < uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x136,"(node->segmentCount < MaxKeys)",
                                  "node->segmentCount < MaxKeys");
      if (!bVar2) goto LAB_00b69aec;
      *puVar5 = 0;
    }
    if (newSeg == (SparseArraySegmentBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x137,"(newSeg != __null)","newSeg != NULL");
      if (!bVar2) goto LAB_00b69aec;
      *puVar5 = 0;
    }
    pSVar10 = (node->children).ptr;
    uVar6 = (ulong)node->segmentCount;
    if (pSVar10 == (SegmentBTree *)0x0) {
      if (uVar6 == 0) {
        uVar6 = 0;
        goto LAB_00b698d1;
      }
      puVar8 = (node->keys).ptr;
      break;
    }
    uVar11 = (ulong)(node->segmentCount + 1);
    do {
      bVar2 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar2) {
        uVar11 = 0;
        break;
      }
      uVar11 = (ulong)((int)uVar11 - 1);
    } while (newSeg->left < (node->keys).ptr[uVar6]);
    if (pSVar10[uVar11].segmentCount == 0x27) {
      SplitChild(recycler,node,(uint32)uVar11,pSVar10 + uVar11);
      uVar3 = (node->keys).ptr[uVar11];
      if (uVar3 != (node->segments).ptr[uVar11]->left) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x15e,"(node->keys[i] == node->segments[i]->left)",
                                    "node->keys[i] == node->segments[i]->left");
        if (!bVar2) goto LAB_00b69aec;
        *puVar5 = 0;
        uVar3 = (node->keys).ptr[uVar11];
      }
      uVar11 = (ulong)((uint32)uVar11 + (uint)(uVar3 < newSeg->left));
      pSVar10 = (node->children).ptr;
    }
    node = pSVar10 + uVar11;
  } while( true );
  while( true ) {
    ppSVar9 = (node->segments).ptr;
    ppSVar9[uVar6] = ppSVar9[uVar12];
    puVar8 = (node->keys).ptr;
    puVar8[uVar6] = puVar8[uVar12];
    uVar6 = uVar11;
    if ((int)uVar11 == 0) break;
    uVar11 = uVar6 - 1;
    uVar12 = uVar11 & 0xffffffff;
    if (puVar8[uVar12] <= newSeg->left) goto LAB_00b698cb;
  }
  uVar6 = 0;
LAB_00b698cb:
  uVar6 = uVar6 & 0xffffffff;
LAB_00b698d1:
  ppSVar9 = (node->segments).ptr;
  if (ppSVar9 == (SparseArraySegmentBase **)0x0) {
    local_70 = (undefined1  [8])&SparseArraySegmentBase*::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x27;
    data.count = (size_t)anon_var_dwarf_6ad2a13;
    data.filename._0_4_ = 0x147;
    pRVar7 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00b69aec;
      *puVar5 = 0;
    }
    data._32_8_ = Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                            (pRVar7,0x138);
    if ((char *)data._32_8_ == (char *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00b69aec;
      *puVar5 = 0;
    }
    addr = &node->segments;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = (SparseArraySegmentBase **)data._32_8_;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    local_70 = (undefined1  [8])&unsigned_int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0x27;
    data.count = (size_t)anon_var_dwarf_6ad2a13;
    data.filename._0_4_ = 0x148;
    pRVar7 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00b69aec;
      *puVar5 = 0;
    }
    puVar8 = (uint *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                               (pRVar7,0x9c);
    if (puVar8 == (uint *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00b69aec:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    Memory::Recycler::WBSetBit((char *)node);
    (node->keys).ptr = puVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(node);
    ppSVar9 = (node->segments).ptr;
  }
  ppSVar9[uVar6] = newSeg;
  (node->keys).ptr[uVar6] = newSeg->left;
  node->segmentCount = node->segmentCount + 1;
  return;
}

Assistant:

void SegmentBTree::InsertNonFullNode(Recycler* recycler, SegmentBTree* node, SparseArraySegmentBase* newSeg)
    {
        Assert(!node->IsFullNode());
        AnalysisAssert(node->segmentCount < MaxKeys);       // Same as !node->IsFullNode()
        Assert(newSeg != NULL);

        if (node->IsLeaf())
        {
            // Move the keys
            uint32 i = node->segmentCount - 1;
            while( (i != -1) && (newSeg->left < node->keys[i]))
            {
                node->segments[i+1] = node->segments[i];
                node->keys[i+1] = node->keys[i];
                i--;
            }
            if (!node->segments)
            {
                // Even though the segments point to a GC pointer, the main array should keep a references
                // as well.  So just make it a leaf allocation
                node->segments = AllocatorNewArrayLeafZ(Recycler, recycler, SparseArraySegmentBase*, MaxKeys);
                node->keys = AllocatorNewArrayLeafZ(Recycler, recycler, uint32, MaxKeys);
            }
            node->segments[i + 1] = newSeg;
            node->keys[i + 1] = newSeg->left;
            node->segmentCount++;
        }
        else
        {
            // find the correct child node
            uint32 i = node->segmentCount-1;

            while((i != -1) && (newSeg->left < node->keys[i]))
            {
                i--;
            }
            i++;

            // Make room if full
            if(node->children[i].IsFullNode())
            {
                // This split doesn't make the tree any deeper as node already has children.
                SplitChild(recycler, node, i, node->children+i);
                Assert(node->keys[i] == node->segments[i]->left);
                if (newSeg->left > node->keys[i])
                {
                    i++;
                }
            }
            InsertNonFullNode(recycler, node->children+i, newSeg);
        }
    }